

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::anon_unknown_5::MaximumMatcher::FindArgumentPathDFS
          (MaximumMatcher *this,int v,vector<bool,_std::allocator<bool>_> *visited)

{
  int v_00;
  bool bVar1;
  ulong uVar2;
  int i;
  long lVar3;
  reference rVar4;
  
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,(long)v);
  *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
  for (lVar3 = 0; uVar2 = (ulong)this->count2_, lVar3 < (long)uVar2; lVar3 = lVar3 + 1) {
    if (((this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_start[lVar3] == -1) && (bVar1 = Match(this,v,(int)lVar3), bVar1)
       ) goto LAB_002e0484;
  }
  lVar3 = 0;
  while( true ) {
    if ((int)uVar2 <= lVar3) {
      return false;
    }
    v_00 = (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar3];
    if (((((long)v_00 != 0xffffffffffffffff) && (bVar1 = Match(this,v,(int)lVar3), bVar1)) &&
        (rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,(long)v_00),
        (*rVar4._M_p & rVar4._M_mask) == 0)) &&
       (bVar1 = FindArgumentPathDFS(this,v_00,visited), bVar1)) break;
    lVar3 = lVar3 + 1;
    uVar2 = (ulong)(uint)this->count2_;
  }
LAB_002e0484:
  (this->match_list2_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[lVar3] = v;
  return true;
}

Assistant:

bool MaximumMatcher::FindArgumentPathDFS(int v, std::vector<bool>* visited) {
  (*visited)[v] = true;
  // We try to match those un-matched nodes on the right side first. This is
  // the step that the naive greedy matching algorithm uses. In the best cases
  // where the greedy algorithm can find a maximum matching, we will always
  // find a match in this step and the performance will be identical to the
  // greedy algorithm.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched == -1 && Match(v, i)) {
      (*match_list2_)[i] = v;
      return true;
    }
  }
  // Then we try those already matched nodes and see if we can find an
  // alternative match for the node matched to them.
  // The greedy algorithm will stop before this and fail to produce the
  // correct result.
  for (int i = 0; i < count2_; ++i) {
    int matched = (*match_list2_)[i];
    if (matched != -1 && Match(v, i)) {
      if (!(*visited)[matched] && FindArgumentPathDFS(matched, visited)) {
        (*match_list2_)[i] = v;
        return true;
      }
    }
  }
  return false;
}